

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# light_manipulate.c
# Opt level: O2

int light_subcapture(light_pcapng section,_func_light_boolean_light_pcapng *predicate,
                    light_pcapng *subcapture)

{
  light_boolean lVar1;
  int iVar2;
  _light_pcapng *section_00;
  _light_pcapng *p_Var3;
  _light_pcapng *p_Var4;
  
  lVar1 = __is_section_header(section);
  if (lVar1 != LIGHT_FALSE) {
    section_00 = __copy_block(section,LIGHT_FALSE);
    p_Var3 = section_00;
    while (section = section->next_block, section != (_light_pcapng *)0x0) {
      lVar1 = (*predicate)(section);
      if (lVar1 != LIGHT_FALSE) {
        p_Var4 = __copy_block(section,LIGHT_FALSE);
        p_Var3->next_block = p_Var4;
        p_Var3 = p_Var4;
      }
    }
    *subcapture = section_00;
    iVar2 = __validate_section(section_00);
    return iVar2;
  }
  fprintf(_stderr,"Error at: %s::%s::%d, %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/rvelea[P]LightPcapNg/src/light_manipulate.c"
          ,"light_subcapture",0xb4,"\"Invalid section header\"");
  return -1;
}

Assistant:

int light_subcapture(const light_pcapng section, light_boolean (*predicate)(const light_pcapng), light_pcapng *subcapture)
{
	if (__is_section_header(section) == 0) {
		PCAPNG_ERROR("Invalid section header");
		return LIGHT_INVALID_SECTION;
	}

	// Root section header is automatically included into the subcapture.
	light_pcapng root = __copy_block(section, LIGHT_FALSE);
	light_pcapng iterator = root;
	light_pcapng next_block = section->next_block;

	while (next_block != NULL) {
		// Predicate functions applies to all block types, including section header blocks.
		if (!!predicate(next_block) == LIGHT_TRUE) {
			iterator->next_block = __copy_block(next_block, LIGHT_FALSE);
			iterator = iterator->next_block;
		}
		next_block = next_block->next_block;
	}

	*subcapture = root;
	return __validate_section(*subcapture);

}